

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::ES5ArrayTypeHandlerBase<int>::TryGetLastDataItemIndex
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 first,uint32 *lastIndex)

{
  bool bVar1;
  uint32 uVar2;
  undefined1 local_38 [8];
  ArrayElementEnumerator e;
  
  uVar2 = 0xffffffff;
  JavascriptArray::ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_38,&arr->super_JavascriptArray,first,0xffffffff);
  while( true ) {
    bVar1 = JavascriptArray::ArrayElementEnumerator::MoveNext<void*>
                      ((ArrayElementEnumerator *)local_38);
    if (!bVar1) break;
    uVar2 = JavascriptArray::ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_38);
  }
  if (uVar2 != 0xffffffff) {
    *lastIndex = uVar2;
  }
  return uVar2 != 0xffffffff;
}

Assistant:

bool ES5ArrayTypeHandlerBase<T>::TryGetLastDataItemIndex(ES5Array* arr, uint32 first, uint32* lastIndex)
    {
        uint32 index = JavascriptArray::InvalidIndex;

        JavascriptArray::ArrayElementEnumerator e(arr, first);
        while (e.MoveNext<Var>())
        {
            index = e.GetIndex();
        }

        if (index != JavascriptArray::InvalidIndex)
        {
            *lastIndex = index;
            return true;
        }

        return false;
    }